

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

bool __thiscall ON_Line::ClosestPointTo(ON_Line *this,ON_3dPoint *point,double *t)

{
  double dVar1;
  double dVar2;
  ON_3dVector local_a8;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dVector local_60;
  double local_48;
  double DoD;
  ON_3dVector D;
  bool rc;
  double *t_local;
  ON_3dPoint *point_local;
  ON_Line *this_local;
  
  D.z._7_1_ = false;
  if (t != (double *)0x0) {
    Direction((ON_3dVector *)&DoD,this);
    local_48 = ON_3dVector::LengthSquared((ON_3dVector *)&DoD);
    if (local_48 <= 0.0) {
      *t = 0.0;
    }
    else {
      ON_3dPoint::operator-(&local_60,point,&this->from);
      dVar1 = ON_3dVector::LengthSquared(&local_60);
      ON_3dPoint::operator-(&local_78,point,&this->to);
      dVar2 = ON_3dVector::LengthSquared(&local_78);
      if (dVar2 < dVar1) {
        ON_3dPoint::operator-(&local_a8,point,&this->to);
        dVar1 = ON_3dVector::operator*(&local_a8,(ON_3dVector *)&DoD);
        *t = dVar1 / local_48 + 1.0;
      }
      else {
        ON_3dPoint::operator-(&local_90,point,&this->from);
        dVar1 = ON_3dVector::operator*(&local_90,(ON_3dVector *)&DoD);
        *t = dVar1 / local_48;
      }
    }
    D.z._7_1_ = true;
  }
  return (bool)D.z._7_1_;
}

Assistant:

bool ON_Line::ClosestPointTo( const ON_3dPoint& point, double *t ) const
{
  bool rc = false;
  if ( t ) {
    const ON_3dVector D = Direction();
    const double DoD = D.LengthSquared();
    if ( DoD > 0.0 ) {
      if ((point - from).LengthSquared() <= (point - to).LengthSquared()) {
        *t = ((point - from)*D)/DoD;
      }
      else {
        *t = 1.0 + ((point - to)*D)/DoD;
      }
      rc = true;
    }
    else {
      *t = 0.0;
			rc = true;			// (GBA) Closet point to a degenerate line works as well
    }
  }
  return rc;
}